

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

double UF::Alloc(uint max_length,PerformanceEvaluator *perf)

{
  double dVar1;
  double dVar2;
  ulong __n;
  
  PerformanceEvaluator::start(perf);
  __n = (ulong)max_length << 2;
  P_ = (uint *)operator_new__(__n);
  memset(P_,0,__n);
  PerformanceEvaluator::stop(perf);
  dVar1 = (perf->counter_).last;
  dVar2 = perf->tick_frequency_;
  PerformanceEvaluator::start(perf);
  memset(P_,0,__n);
  PerformanceEvaluator::stop(perf);
  return (dVar1 * 1000.0) / dVar2 - ((perf->counter_).last * 1000.0) / perf->tick_frequency_;
}

Assistant:

static double Alloc(unsigned max_length, PerformanceEvaluator& perf) {
        perf.start();
        P_ = new unsigned[max_length];
        memset(P_, 0, max_length * sizeof(unsigned));
        perf.stop();
        double t = perf.last();
        perf.start();
        memset(P_, 0, max_length * sizeof(unsigned));
        perf.stop();
        return t - perf.last();
    }